

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void WriteArrayVars(FSerializer *file,FWorldGlobalArray *vars,uint count,char *key)

{
  bool bVar1;
  hash_t hVar2;
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *this;
  ulong uVar3;
  FString arraykey;
  int v;
  Pair *pair;
  ConstIterator it;
  FString local_70;
  uint local_64;
  ConstPair *local_60;
  char *local_58;
  ulong local_50;
  FWorldGlobalArray *local_48;
  TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_> local_40;
  
  uVar3 = 0;
  local_48 = vars;
  while( true ) {
    if (count == uVar3) {
      return;
    }
    hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(vars);
    if (hVar2 != 0) break;
    uVar3 = uVar3 + 1;
    vars = vars + 1;
  }
  bVar1 = FSerializer::BeginObject(file,key);
  if (!bVar1) {
    return;
  }
  local_58 = FString::NullString.Nothing;
  local_50 = (ulong)count;
  for (; uVar3 != local_50; uVar3 = uVar3 + 1) {
    this = local_48 + uVar3;
    hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(this);
    if (hVar2 != 0) {
      local_70.Chars = local_58;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      FString::Format(&local_70,"%d",uVar3 & 0xffffffff);
      bVar1 = FSerializer::BeginObject(file,local_70.Chars);
      if (bVar1) {
        local_40.Position = 0;
        local_40.Map = this;
        while (bVar1 = TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>
                       ::NextPair(&local_40,&local_60), bVar1) {
          FString::Format(&local_70,"%d",(ulong)(uint)local_60->Key);
          local_64 = local_60->Value;
          FSerializer::operator()(file,local_70.Chars,(int *)&local_64);
        }
        FSerializer::EndObject(file);
      }
      FString::~FString(&local_70);
    }
  }
  FSerializer::EndObject(file);
  return;
}

Assistant:

static void WriteArrayVars (FSerializer &file, FWorldGlobalArray *vars, unsigned int count, const char *key)
{
	unsigned int i;

	// Find the first non-empty array.
	for (i = 0; i < count; ++i)
	{
		if (vars[i].CountUsed() != 0)
			break;
	}
	if (i < count)
	{
		if (file.BeginObject(key))
		{
			for(;i<count;i++)
			{
				if (vars[i].CountUsed())
				{
					FString arraykey;

					arraykey.Format("%d", i);
					if (file.BeginObject(arraykey))
					{
						FWorldGlobalArray::ConstIterator it(vars[i]);
						const FWorldGlobalArray::Pair *pair;

						while (it.NextPair(pair))
						{
							arraykey.Format("%d", pair->Key);
							int v = pair->Value;
							file(arraykey.GetChars(), v);
						}
						file.EndObject();
					}
				}
			}
			file.EndObject();
		}
	}
}